

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.h
# Opt level: O0

void __thiscall CPASVCommand::CPASVCommand(CPASVCommand *this)

{
  CPASVCommand *this_local;
  
  CCommand::CCommand(&this->super_CCommand);
  (this->super_CCommand)._vptr_CCommand = (_func_int **)&PTR_MatchCommand_0014f710;
  std::__cxx11::string::operator=((string *)&(this->super_CCommand).m_Command,"PASV");
  return;
}

Assistant:

CPASVCommand(){m_Command = "PASV";}